

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalar_replacement_pass.cpp
# Opt level: O0

bool __thiscall
spvtools::opt::ScalarReplacementPass::ReplaceWholeDebugValue
          (ScalarReplacementPass *this,Instruction *dbg_value,
          vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
          *replacements)

{
  initializer_list<unsigned_int> init_list;
  initializer_list<unsigned_int> init_list_00;
  bool bVar1;
  IRContext *pIVar2;
  BasicBlock *block_00;
  __uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
  *p_Var3;
  Instruction *pIVar4;
  pointer pIVar5;
  ConstantManager *this_00;
  DefUseManager *this_01;
  Instruction *added_instr;
  iterator local_110;
  undefined8 local_108;
  SmallVector<unsigned_int,_2UL> local_100;
  Operand local_d8;
  uint32_t local_a4;
  iterator local_a0;
  undefined8 local_98;
  SmallVector<unsigned_int,_2UL> local_90;
  uint local_68;
  uint32_t local_64;
  uint32_t new_id;
  unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
  new_dbg_value;
  Instruction *var;
  const_iterator __end2;
  const_iterator __begin2;
  vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> *__range2;
  BasicBlock *block;
  int32_t idx;
  vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
  *replacements_local;
  Instruction *dbg_value_local;
  ScalarReplacementPass *this_local;
  
  block._4_4_ = 0;
  pIVar2 = Pass::context((Pass *)this);
  block_00 = IRContext::get_instr_block(pIVar2,dbg_value);
  __end2 = std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
           ::begin(replacements);
  var = (Instruction *)
        std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>::
        end(replacements);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end2,(__normal_iterator<spvtools::opt::Instruction_*const_*,_std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>_>
                                     *)&var), bVar1) {
    p_Var3 = (__uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
              *)__gnu_cxx::
                __normal_iterator<spvtools::opt::Instruction_*const_*,_std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>_>
                ::operator*(&__end2);
    new_dbg_value._M_t.
    super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
    ._M_t.
    super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
    .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl =
         *(__uniq_ptr_data<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>,_true,_true>
           *)&p_Var3->_M_t;
    pIVar2 = Pass::context((Pass *)this);
    pIVar4 = opt::Instruction::Clone(dbg_value,pIVar2);
    std::unique_ptr<spvtools::opt::Instruction,std::default_delete<spvtools::opt::Instruction>>::
    unique_ptr<std::default_delete<spvtools::opt::Instruction>,void>
              ((unique_ptr<spvtools::opt::Instruction,std::default_delete<spvtools::opt::Instruction>>
                *)&stack0xffffffffffffffa0,pIVar4);
    local_64 = Pass::TakeNextId((Pass *)this);
    bVar1 = local_64 != 0;
    if (bVar1) {
      pIVar5 = std::
               unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
               ::operator->((unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                             *)&stack0xffffffffffffffa0);
      opt::Instruction::SetResultId(pIVar5,local_64);
      pIVar5 = std::
               unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
               ::operator->((unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                             *)&stack0xffffffffffffffa0);
      local_a4 = opt::Instruction::result_id
                           ((Instruction *)
                            new_dbg_value._M_t.
                            super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                            .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl
                           );
      local_a0 = &local_a4;
      local_98 = 1;
      init_list_00._M_len = 1;
      init_list_00._M_array = local_a0;
      utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_90,init_list_00);
      opt::Instruction::SetOperand(pIVar5,5,&local_90);
      utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_90);
      pIVar5 = std::
               unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
               ::operator->((unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                             *)&stack0xffffffffffffffa0);
      pIVar2 = Pass::context((Pass *)this);
      this_00 = IRContext::get_constant_mgr(pIVar2);
      added_instr._4_4_ = analysis::ConstantManager::GetSIntConstId(this_00,block._4_4_);
      local_110 = (iterator)((long)&added_instr + 4);
      local_108 = 1;
      init_list._M_len = 1;
      init_list._M_array = local_110;
      utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_100,init_list);
      Operand::Operand(&local_d8,SPV_OPERAND_TYPE_ID,&local_100);
      opt::Instruction::AddOperand(pIVar5,&local_d8);
      Operand::~Operand(&local_d8);
      utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_100);
      pIVar4 = opt::Instruction::InsertBefore
                         (dbg_value,
                          (unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                           *)&stack0xffffffffffffffa0);
      this_01 = Pass::get_def_use_mgr((Pass *)this);
      analysis::DefUseManager::AnalyzeInstDefUse(this_01,pIVar4);
      pIVar2 = Pass::context((Pass *)this);
      IRContext::set_instr_block(pIVar2,pIVar4,block_00);
      block._4_4_ = block._4_4_ + 1;
    }
    else {
      this_local._7_1_ = 0;
    }
    local_68 = (uint)!bVar1;
    std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>::
    ~unique_ptr((unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                 *)&stack0xffffffffffffffa0);
    if (local_68 != 0) goto LAB_0088d7c8;
    __gnu_cxx::
    __normal_iterator<spvtools::opt::Instruction_*const_*,_std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>_>
    ::operator++(&__end2);
  }
  this_local._7_1_ = 1;
LAB_0088d7c8:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool ScalarReplacementPass::ReplaceWholeDebugValue(
    Instruction* dbg_value, const std::vector<Instruction*>& replacements) {
  int32_t idx = 0;
  BasicBlock* block = context()->get_instr_block(dbg_value);
  for (auto var : replacements) {
    // Clone the DebugValue.
    std::unique_ptr<Instruction> new_dbg_value(dbg_value->Clone(context()));
    uint32_t new_id = TakeNextId();
    if (new_id == 0) return false;
    new_dbg_value->SetResultId(new_id);
    // Update 'Value' operand to the |replacements|.
    new_dbg_value->SetOperand(kDebugValueOperandValueIndex, {var->result_id()});
    // Append 'Indexes' operand.
    new_dbg_value->AddOperand(
        {SPV_OPERAND_TYPE_ID,
         {context()->get_constant_mgr()->GetSIntConstId(idx)}});
    // Insert the new DebugValue to the basic block.
    auto* added_instr = dbg_value->InsertBefore(std::move(new_dbg_value));
    get_def_use_mgr()->AnalyzeInstDefUse(added_instr);
    context()->set_instr_block(added_instr, block);
    ++idx;
  }
  return true;
}